

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

char * ps_alignment_iter_name(ps_alignment_iter_t *itor)

{
  int iVar1;
  int iVar2;
  ps_alignment_entry_t *ppVar3;
  char *pcVar4;
  ps_alignment_iter_t *local_30;
  int len;
  ps_alignment_entry_t *ent;
  ps_alignment_iter_t *itor_local;
  
  if (itor == (ps_alignment_iter_t *)0x0) {
    itor_local = (ps_alignment_iter_t *)0x0;
  }
  else {
    ppVar3 = ps_alignment_iter_get(itor);
    if (itor->vec == &itor->al->word) {
      if ((ppVar3->id).wid < 0) {
        local_30 = (ps_alignment_iter_t *)0x0;
      }
      else {
        local_30 = (ps_alignment_iter_t *)itor->al->d2p->dict->word[(ppVar3->id).wid].word;
      }
      itor_local = local_30;
    }
    else if (itor->vec == &itor->al->sseq) {
      itor_local = (ps_alignment_iter_t *)
                   bin_mdef_ciphone_str(itor->al->d2p->mdef,(int)(ppVar3->id).pid.cipid);
    }
    else if (itor->vec == &itor->al->state) {
      iVar1 = snprintf((char *)0x0,0,"%u",(ulong)(ppVar3->id).senid);
      if (iVar1 == 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                       ,0x1a7,"snprintf() failed");
        itor_local = (ps_alignment_iter_t *)0x0;
      }
      else {
        if (itor->name != (char *)0x0) {
          ckd_free(itor->name);
        }
        pcVar4 = (char *)__ckd_malloc__((long)(iVar1 + 1),
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                                        ,0x1ac);
        itor->name = pcVar4;
        iVar2 = snprintf(itor->name,(long)(iVar1 + 1),"%u",(ulong)(ppVar3->id).senid);
        if (iVar2 == iVar1) {
          itor_local = (ps_alignment_iter_t *)itor->name;
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                         ,0x1ae,"snprintf() failed");
          itor_local = (ps_alignment_iter_t *)0x0;
        }
      }
    }
    else {
      itor_local = (ps_alignment_iter_t *)0x0;
    }
  }
  return (char *)itor_local;
}

Assistant:

const char *
ps_alignment_iter_name(ps_alignment_iter_t *itor)
{
    ps_alignment_entry_t *ent;
    if (itor == NULL)
        return NULL;
    ent = ps_alignment_iter_get(itor);
    if (itor->vec == &itor->al->word) {
        return dict_wordstr(itor->al->d2p->dict,
                            ent->id.wid);
    }
    else if (itor->vec == &itor->al->sseq) {
        return bin_mdef_ciphone_str(itor->al->d2p->mdef,
                                    ent->id.pid.cipid);
    }
    else if (itor->vec == &itor->al->state) {
        int len = snprintf(NULL, 0, "%u", ent->id.senid);
        if (len == 0) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        if (itor->name)
            ckd_free(itor->name);
        itor->name = ckd_malloc(len + 1);
        if (snprintf(itor->name, len + 1, "%u", ent->id.senid) != len) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        return itor->name;
    }
    else
        return NULL;
}